

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_free(t_template *x)

{
  t_template *x_local;
  
  if (*x->t_sym->s_name != '\0') {
    pd_unbind(&x->t_pdobj,x->t_sym);
  }
  freebytes(x->t_vec,(long)x->t_n * 0x18);
  template_takeofflist(x);
  return;
}

Assistant:

void template_free(t_template *x)
{
    if (*x->t_sym->s_name)
        pd_unbind(&x->t_pdobj, x->t_sym);
    t_freebytes(x->t_vec, x->t_n * sizeof(*x->t_vec));
    template_takeofflist(x);
}